

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

uint32_t prf_model_vertex_palette_get_next_index(prf_model_t *model,uint32_t idx)

{
  uint32_t length;
  uint32_t idx_local;
  prf_model_t *model_local;
  uint local_4;
  
  local_4 = idx + *(ushort *)(model->vertex_palette->data + (ulong)idx + 2);
  if (*(uint *)model->vertex_palette->data <= local_4) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t
prf_model_vertex_palette_get_next_index(
    prf_model_t * model,
    uint32_t idx )
{
    uint32_t length;
    assert( model != NULL && idx >= 8 && ! (idx & 3) );
    assert( model->vertex_palette != NULL );

    length = ((uint32_t *)(model->vertex_palette->data))[0];
    assert( idx < length );
    idx = idx + ((uint16_t *)(model->vertex_palette->data + idx))[1];
    if ( idx >= length ) return 0;
    return idx;
}